

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_scheduler.cpp
# Opt level: O1

idx_t __thiscall
duckdb::TaskScheduler::ExecuteTasks(TaskScheduler *this,atomic<bool> *marker,idx_t max_tasks)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  idx_t iVar2;
  bool bVar3;
  uint uVar4;
  pointer this_00;
  Task *pTVar5;
  InternalException *this_01;
  ulong uVar6;
  shared_ptr<duckdb::Task,_true> task;
  shared_ptr<duckdb::Task,_true> local_68;
  idx_t local_58;
  string local_50;
  
  uVar6 = 0;
  while( true ) {
    if (((marker->_M_base)._M_i & 1U) == 0) {
      return uVar6;
    }
    if (max_tasks <= uVar6) break;
    local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_00 = unique_ptr<duckdb::ConcurrentQueue,_std::default_delete<duckdb::ConcurrentQueue>,_true>
              ::operator->(&this->queue);
    bVar3 = duckdb_moodycamel::
            ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
            ::try_dequeue<duckdb::shared_ptr<duckdb::Task,true>>
                      ((ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,true>,duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                        *)this_00,&local_68);
    iVar2 = uVar6;
    if (bVar3) {
      pTVar5 = shared_ptr<duckdb::Task,_true>::operator->(&local_68);
      uVar4 = (*pTVar5->_vptr_Task[2])(pTVar5,0);
      _Var1._M_pi = local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      iVar2 = local_58;
      switch(uVar4 & 0xff) {
      case 0:
      case 2:
        local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_pi);
        }
        uVar6 = uVar6 + 1;
        iVar2 = local_58;
        break;
      case 1:
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "Task should not return TASK_NOT_FINISHED in PROCESS_ALL mode","");
        InternalException::InternalException(this_01,&local_50);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case 3:
        pTVar5 = shared_ptr<duckdb::Task,_true>::operator->(&local_68);
        (*pTVar5->_vptr_Task[3])(pTVar5);
        _Var1._M_pi = local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
        local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        iVar2 = local_58;
        if (_Var1._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Var1._M_pi);
          iVar2 = local_58;
        }
      }
    }
    local_58 = iVar2;
    if (local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_68.internal.super___shared_ptr<duckdb::Task,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (!bVar3) {
      return local_58;
    }
  }
  return uVar6;
}

Assistant:

idx_t TaskScheduler::ExecuteTasks(atomic<bool> *marker, idx_t max_tasks) {
#ifndef DUCKDB_NO_THREADS
	idx_t completed_tasks = 0;
	// loop until the marker is set to false
	while (*marker && completed_tasks < max_tasks) {
		shared_ptr<Task> task;
		if (!queue->q.try_dequeue(task)) {
			return completed_tasks;
		}
		auto execute_result = task->Execute(TaskExecutionMode::PROCESS_ALL);

		switch (execute_result) {
		case TaskExecutionResult::TASK_FINISHED:
		case TaskExecutionResult::TASK_ERROR:
			task.reset();
			completed_tasks++;
			break;
		case TaskExecutionResult::TASK_NOT_FINISHED:
			throw InternalException("Task should not return TASK_NOT_FINISHED in PROCESS_ALL mode");
		case TaskExecutionResult::TASK_BLOCKED:
			task->Deschedule();
			task.reset();
			break;
		}
	}
	return completed_tasks;
#else
	throw NotImplementedException("DuckDB was compiled without threads! Background thread loop is not allowed.");
#endif
}